

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::InstanceIntersectorK<4>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  NodeRef *pNVar1;
  NodeRef *pNVar2;
  NodeRef *pNVar3;
  float *pfVar4;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar10;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar11;
  bool bVar12;
  uint uVar13;
  size_t sVar14;
  size_t sVar15;
  NodeRef NVar16;
  long lVar17;
  NodeRef *pNVar18;
  int iVar19;
  ulong uVar20;
  undefined4 uVar21;
  ulong uVar22;
  size_t sVar23;
  ulong uVar24;
  ulong uVar25;
  NodeRef nodeRef;
  Primitive *pPVar26;
  size_t sVar27;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar28;
  bool bVar29;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar30;
  undefined1 auVar31 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  vint4 ai_2;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 ai;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_ZMM2 [64];
  vint4 ai_1;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  vint4 ai_3;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  vint4 bi;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  vint4 bi_1;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  vint4 bi_3;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  vint4 bi_2;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  float fVar93;
  float fVar96;
  undefined1 auVar95 [64];
  float fVar97;
  float fVar100;
  undefined1 auVar99 [64];
  float fVar101;
  float fVar105;
  undefined1 auVar103 [64];
  vint<4> octant;
  Precalculations pre;
  vint4 bi_8;
  vbool<4> valid_leaf;
  undefined1 local_1768 [16];
  RayQueryContext *local_1750;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  undefined1 local_1718 [16];
  undefined1 local_1708 [16];
  undefined1 local_16f8 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16e8;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar94 [16];
  undefined1 auVar98 [16];
  undefined1 auVar102 [16];
  undefined1 auVar104 [64];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar31 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
      auVar43 = vpcmpeqd_avx(auVar31,(undefined1  [16])valid_i->field_0);
      uVar13 = vmovmskps_avx(auVar43);
      if (uVar13 == 0) {
        return;
      }
      stack_node[0xb2].ptr = (size_t)This->ptr;
      stack_node[0xb3].ptr = (size_t)(uVar13 & 0xff);
      auVar44 = *(undefined1 (*) [16])ray;
      auVar92 = ZEXT1664(auVar44);
      auVar47 = *(undefined1 (*) [16])(ray + 0x10);
      auVar95 = ZEXT1664(auVar47);
      auVar55 = *(undefined1 (*) [16])(ray + 0x20);
      auVar99 = ZEXT1664(auVar55);
      auVar54 = *(undefined1 (*) [16])(ray + 0x40);
      auVar60._8_4_ = 0x7fffffff;
      auVar60._0_8_ = 0x7fffffff7fffffff;
      auVar60._12_4_ = 0x7fffffff;
      auVar53 = vandps_avx(auVar54,auVar60);
      auVar76._8_4_ = 0x219392ef;
      auVar76._0_8_ = 0x219392ef219392ef;
      auVar76._12_4_ = 0x219392ef;
      auVar53 = vcmpps_avx(auVar53,auVar76,1);
      auVar62 = vblendvps_avx(auVar54,auVar76,auVar53);
      auVar53 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar60);
      auVar53 = vcmpps_avx(auVar53,auVar76,1);
      auVar61 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar76,auVar53);
      auVar53 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar60);
      auVar53 = vcmpps_avx(auVar53,auVar76,1);
      auVar53 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar76,auVar53);
      auVar60 = vrcpps_avx(auVar62);
      fVar6 = auVar60._0_4_;
      auVar70._0_4_ = auVar62._0_4_ * fVar6;
      fVar7 = auVar60._4_4_;
      auVar70._4_4_ = auVar62._4_4_ * fVar7;
      fVar8 = auVar60._8_4_;
      auVar70._8_4_ = auVar62._8_4_ * fVar8;
      fVar9 = auVar60._12_4_;
      auVar70._12_4_ = auVar62._12_4_ * fVar9;
      auVar85._8_4_ = 0x3f800000;
      auVar85._0_8_ = &DAT_3f8000003f800000;
      auVar85._12_4_ = 0x3f800000;
      auVar62 = vsubps_avx(auVar85,auVar70);
      fVar93 = fVar6 + fVar6 * auVar62._0_4_;
      fVar96 = fVar7 + fVar7 * auVar62._4_4_;
      auVar94._0_8_ = CONCAT44(fVar96,fVar93);
      auVar94._8_4_ = fVar8 + fVar8 * auVar62._8_4_;
      auVar94._12_4_ = fVar9 + fVar9 * auVar62._12_4_;
      auVar103 = ZEXT1664(auVar94);
      auVar62 = vrcpps_avx(auVar61);
      fVar6 = auVar62._0_4_;
      auVar77._0_4_ = auVar61._0_4_ * fVar6;
      fVar7 = auVar62._4_4_;
      auVar77._4_4_ = auVar61._4_4_ * fVar7;
      fVar8 = auVar62._8_4_;
      auVar77._8_4_ = auVar61._8_4_ * fVar8;
      fVar9 = auVar62._12_4_;
      auVar77._12_4_ = auVar61._12_4_ * fVar9;
      auVar62 = vsubps_avx(auVar85,auVar77);
      fVar97 = fVar6 + fVar6 * auVar62._0_4_;
      fVar100 = fVar7 + fVar7 * auVar62._4_4_;
      auVar98._0_8_ = CONCAT44(fVar100,fVar97);
      auVar98._8_4_ = fVar8 + fVar8 * auVar62._8_4_;
      auVar98._12_4_ = fVar9 + fVar9 * auVar62._12_4_;
      auVar32 = ZEXT1664(auVar98);
      auVar62 = vrcpps_avx(auVar53);
      fVar6 = auVar62._0_4_;
      auVar61._0_4_ = auVar53._0_4_ * fVar6;
      fVar7 = auVar62._4_4_;
      auVar61._4_4_ = auVar53._4_4_ * fVar7;
      fVar8 = auVar62._8_4_;
      auVar61._8_4_ = auVar53._8_4_ * fVar8;
      fVar9 = auVar62._12_4_;
      auVar61._12_4_ = auVar53._12_4_ * fVar9;
      auVar53 = vsubps_avx(auVar85,auVar61);
      fVar101 = fVar6 + fVar6 * auVar53._0_4_;
      fVar105 = fVar7 + fVar7 * auVar53._4_4_;
      auVar102._0_8_ = CONCAT44(fVar105,fVar101);
      auVar102._8_4_ = fVar8 + fVar8 * auVar53._8_4_;
      auVar102._12_4_ = fVar9 + fVar9 * auVar53._12_4_;
      auVar104 = ZEXT1664(auVar102);
      auVar62 = ZEXT816(0) << 0x20;
      auVar53 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar62);
      stack_node[0xca].ptr = auVar53._0_8_;
      stack_node[0xcb].ptr = auVar53._8_8_;
      auVar53 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar62);
      stack_node[200].ptr = auVar53._0_8_;
      stack_node[0xc9].ptr = auVar53._8_8_;
      auVar54 = vcmpps_avx(auVar54,auVar62,1);
      auVar53._8_4_ = 1;
      auVar53._0_8_ = 0x100000001;
      auVar53._12_4_ = 1;
      auVar54 = vandps_avx(auVar54,auVar53);
      auVar53 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar62,1);
      auVar71._8_4_ = 2;
      auVar71._0_8_ = 0x200000002;
      auVar71._12_4_ = 2;
      auVar53 = vandps_avx(auVar53,auVar71);
      auVar53 = vorps_avx(auVar53,auVar54);
      auVar54 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar62,1);
      auVar62._8_4_ = 4;
      auVar62._0_8_ = 0x400000004;
      auVar62._12_4_ = 4;
      auVar54 = vandps_avx(auVar54,auVar62);
      auVar31 = vpor_avx(auVar43 ^ auVar31,auVar54);
      auVar31 = vpor_avx(auVar31,auVar53);
      stack_node[0xc6].ptr = auVar31._0_8_;
      stack_node[199].ptr = auVar31._8_8_;
      stack_node[0xab].ptr = 8;
      stack_node[0xb5].ptr = (size_t)context;
      stack_node[0xb4].ptr = (size_t)ray;
      stack_node[0xc2].ptr = auVar44._0_8_;
      stack_node[0xc3].ptr = auVar44._8_8_;
      stack_node[0xc0].ptr = auVar47._0_8_;
      stack_node[0xc1].ptr = auVar47._8_8_;
      stack_node[0xbe].ptr = auVar55._0_8_;
      stack_node[0xbf].ptr = auVar55._8_8_;
      stack_node[0xbc].ptr = auVar94._0_8_;
      stack_node[0xbd].ptr = auVar94._8_8_;
      stack_node[0xba].ptr = auVar98._0_8_;
      stack_node[0xbb].ptr = auVar98._8_8_;
      stack_node[0xb8].ptr = auVar102._0_8_;
      stack_node[0xb9].ptr = auVar102._8_8_;
LAB_0037ce21:
      lVar17 = 0;
      if (stack_node[0xb3].ptr != 0) {
        for (; (stack_node[0xb3].ptr >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
        }
      }
      uVar21 = *(undefined4 *)((long)&stack_node[0xc6].ptr + lVar17 * 4);
      auVar31._4_4_ = uVar21;
      auVar31._0_4_ = uVar21;
      auVar31._8_4_ = uVar21;
      auVar31._12_4_ = uVar21;
      auVar55 = vpcmpeqd_avx(auVar31,stack_node._1584_16_);
      uVar21 = vmovmskps_avx(auVar55);
      stack_node[0xb3].ptr = ~CONCAT44((int)((ulong)lVar17 >> 0x20),uVar21) & stack_node[0xb3].ptr;
      auVar88._8_4_ = 0x7f800000;
      auVar88._0_8_ = 0x7f8000007f800000;
      auVar88._12_4_ = 0x7f800000;
      auVar31 = vblendvps_avx(auVar88,auVar103._0_16_,auVar55);
      auVar43 = vshufps_avx(auVar31,auVar31,0xb1);
      auVar43 = vminps_avx(auVar43,auVar31);
      auVar44 = vshufpd_avx(auVar43,auVar43,1);
      auVar31 = vblendvps_avx(auVar88,auVar32._0_16_,auVar55);
      auVar43 = vminps_avx(auVar44,auVar43);
      auVar44 = vshufps_avx(auVar31,auVar31,0xb1);
      auVar31 = vminps_avx(auVar44,auVar31);
      auVar44 = vshufpd_avx(auVar31,auVar31,1);
      auVar31 = vminps_avx(auVar44,auVar31);
      auVar43 = vinsertps_avx(auVar43,auVar31,0x1c);
      auVar31 = vblendvps_avx(auVar88,auVar104._0_16_,auVar55);
      auVar44 = vshufps_avx(auVar31,auVar31,0xb1);
      auVar31 = vminps_avx(auVar44,auVar31);
      auVar44 = vshufpd_avx(auVar31,auVar31,1);
      auVar31 = vminps_avx(auVar44,auVar31);
      auVar53 = vinsertps_avx(auVar43,auVar31,0x20);
      auVar41._8_4_ = 0xff800000;
      auVar41._0_8_ = 0xff800000ff800000;
      auVar41._12_4_ = 0xff800000;
      auVar31 = vblendvps_avx(auVar41,auVar103._0_16_,auVar55);
      auVar43 = vshufps_avx(auVar31,auVar31,0xb1);
      auVar43 = vmaxps_avx(auVar43,auVar31);
      auVar44 = vshufpd_avx(auVar43,auVar43,1);
      auVar31 = vblendvps_avx(auVar41,auVar32._0_16_,auVar55);
      auVar43 = vmaxps_avx(auVar44,auVar43);
      auVar44 = vshufps_avx(auVar31,auVar31,0xb1);
      auVar31 = vmaxps_avx(auVar44,auVar31);
      auVar44 = vshufpd_avx(auVar31,auVar31,1);
      auVar31 = vmaxps_avx(auVar44,auVar31);
      auVar43 = vinsertps_avx(auVar43,auVar31,0x1c);
      auVar31 = vblendvps_avx(auVar41,auVar104._0_16_,auVar55);
      auVar44 = vshufps_avx(auVar31,auVar31,0xb1);
      auVar31 = vmaxps_avx(auVar44,auVar31);
      auVar44 = vshufpd_avx(auVar31,auVar31,1);
      auVar31 = vmaxps_avx(auVar44,auVar31);
      auVar62 = vinsertps_avx(auVar43,auVar31,0x20);
      auVar54 = vcmpps_avx(auVar53,_DAT_01feba10,5);
      auVar31 = vblendvps_avx(auVar62,auVar53,auVar54);
      auVar43 = vmovshdup_avx(auVar31);
      stack_node[0xb7].ptr = (ulong)(auVar43._0_4_ < 0.0) << 4 | 0x20;
      auVar43 = vshufpd_avx(auVar31,auVar31,1);
      uVar20 = (ulong)(auVar43._0_4_ < 0.0) << 4 | 0x40;
      stack_node[0xb6].ptr = stack_node[0xb7].ptr ^ 0x10;
      auVar43 = vblendvps_avx(auVar88,auVar92._0_16_,auVar55);
      auVar44 = vshufps_avx(auVar43,auVar43,0xb1);
      auVar43 = vminps_avx(auVar44,auVar43);
      auVar44 = vshufpd_avx(auVar43,auVar43,1);
      auVar44 = vminps_avx(auVar44,auVar43);
      auVar43 = vblendvps_avx(auVar88,auVar95._0_16_,auVar55);
      auVar47 = vshufps_avx(auVar43,auVar43,0xb1);
      auVar43 = vminps_avx(auVar47,auVar43);
      auVar47 = vshufpd_avx(auVar43,auVar43,1);
      auVar43 = vminps_avx(auVar47,auVar43);
      auVar44 = vinsertps_avx(auVar44,auVar43,0x1c);
      auVar43 = vblendvps_avx(auVar88,auVar99._0_16_,auVar55);
      auVar47 = vshufps_avx(auVar43,auVar43,0xb1);
      auVar43 = vminps_avx(auVar47,auVar43);
      auVar47 = vshufpd_avx(auVar43,auVar43,1);
      auVar43 = vminps_avx(auVar47,auVar43);
      auVar44 = vinsertps_avx(auVar44,auVar43,0x20);
      auVar43 = vblendvps_avx(auVar41,auVar92._0_16_,auVar55);
      auVar47 = vshufps_avx(auVar43,auVar43,0xb1);
      auVar43 = vmaxps_avx(auVar47,auVar43);
      auVar47 = vshufpd_avx(auVar43,auVar43,1);
      auVar47 = vmaxps_avx(auVar47,auVar43);
      auVar43 = vblendvps_avx(auVar41,auVar95._0_16_,auVar55);
      auVar61 = vshufps_avx(auVar43,auVar43,0xb1);
      auVar43 = vmaxps_avx(auVar61,auVar43);
      auVar61 = vshufpd_avx(auVar43,auVar43,1);
      auVar43 = vmaxps_avx(auVar61,auVar43);
      auVar47 = vinsertps_avx(auVar47,auVar43,0x1c);
      auVar43 = vblendvps_avx(auVar41,auVar99._0_16_,auVar55);
      auVar61 = vshufps_avx(auVar43,auVar43,0xb1);
      auVar43 = vmaxps_avx(auVar61,auVar43);
      auVar61 = vshufpd_avx(auVar43,auVar43,1);
      auVar43 = vmaxps_avx(auVar61,auVar43);
      auVar47 = vinsertps_avx(auVar47,auVar43,0x20);
      auVar43 = vblendvps_avx(auVar47,auVar44,auVar54);
      auVar44 = vblendvps_avx(auVar44,auVar47,auVar54);
      auVar47 = vblendvps_avx(auVar41,stack_node._1600_16_,auVar55);
      auVar61 = vshufps_avx(auVar47,auVar47,0xb1);
      auVar61 = vmaxps_avx(auVar61,auVar47);
      auVar70 = vshufpd_avx(auVar61,auVar61,1);
      auVar42._8_4_ = 0x7f800000;
      auVar42._0_8_ = 0x7f8000007f800000;
      auVar42._12_4_ = 0x7f800000;
      auVar55 = vblendvps_avx(auVar42,stack_node._1616_16_,auVar55);
      auVar60 = vshufps_avx(auVar55,auVar55,0xb1);
      stack_node[0xe8].ptr = auVar55._0_8_;
      stack_node[0xe9].ptr = auVar55._8_8_;
      auVar60 = vminps_avx(auVar60,auVar55);
      auVar55 = vmaxss_avx(auVar70,auVar61);
      auVar80 = ZEXT1664(auVar47);
      auVar47 = vblendvps_avx(auVar53,auVar62,auVar54);
      auVar54._0_4_ = auVar31._0_4_ * auVar44._0_4_;
      auVar54._4_4_ = auVar31._4_4_ * auVar44._4_4_;
      auVar54._8_4_ = auVar31._8_4_ * auVar44._8_4_;
      auVar54._12_4_ = auVar31._12_4_ * auVar44._12_4_;
      auVar44._0_4_ = auVar43._0_4_ * auVar47._0_4_;
      auVar44._4_4_ = auVar43._4_4_ * auVar47._4_4_;
      auVar44._8_4_ = auVar43._8_4_ * auVar47._8_4_;
      auVar44._12_4_ = auVar43._12_4_ * auVar47._12_4_;
      uVar25 = (ulong)(auVar31._0_4_ < 0.0) * 0x10;
      stack_node[0xec].ptr = *(size_t *)(stack_node[0xb2].ptr + 0x70);
      stack_node[0xed].ptr._0_4_ = 0;
      auVar43 = vshufps_avx(auVar31,auVar31,0);
      stack_node[0xe6].ptr = auVar43._0_8_;
      stack_node[0xe7].ptr = auVar43._8_8_;
      auVar43 = vshufps_avx(auVar54,auVar54,0);
      stack_node[0xe4].ptr = auVar43._0_8_;
      stack_node[0xe5].ptr = auVar43._8_8_;
      auVar43 = vshufps_avx(auVar31,auVar31,0x55);
      stack_node[0xe2].ptr = auVar43._0_8_;
      stack_node[0xe3].ptr = auVar43._8_8_;
      auVar43 = vshufps_avx(auVar54,auVar54,0x55);
      stack_node[0xe0].ptr = auVar43._0_8_;
      stack_node[0xe1].ptr = auVar43._8_8_;
      auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
      stack_node[0xde].ptr = auVar31._0_8_;
      stack_node[0xdf].ptr = auVar31._8_8_;
      auVar31 = vshufps_avx(auVar54,auVar54,0xaa);
      stack_node[0xdc].ptr = auVar31._0_8_;
      stack_node[0xdd].ptr = auVar31._8_8_;
      auVar31 = vshufps_avx(auVar47,auVar47,0);
      stack_node[0xda].ptr = auVar31._0_8_;
      stack_node[0xdb].ptr = auVar31._8_8_;
      auVar31 = vshufps_avx(auVar44,auVar44,0);
      stack_node[0xd8].ptr = auVar31._0_8_;
      stack_node[0xd9].ptr = auVar31._8_8_;
      auVar31 = vshufps_avx(auVar47,auVar47,0x55);
      stack_node[0xd6].ptr = auVar31._0_8_;
      stack_node[0xd7].ptr = auVar31._8_8_;
      auVar31 = vshufps_avx(auVar60,auVar60,0);
      auVar43 = vshufps_avx(auVar60,auVar60,0xaa);
      auVar31 = vminps_avx(auVar43,auVar31);
      stack_node[0xd4].ptr = auVar31._0_8_;
      stack_node[0xd5].ptr = auVar31._8_8_;
      auVar31 = vshufps_avx(auVar44,auVar44,0x55);
      stack_node[0xd2].ptr = auVar31._0_8_;
      stack_node[0xd3].ptr = auVar31._8_8_;
      auVar31 = vshufps_avx(auVar47,auVar47,0xaa);
      stack_node[0xd0].ptr = auVar31._0_8_;
      stack_node[0xd1].ptr = auVar31._8_8_;
      auVar33 = ZEXT1664(auVar55);
      auVar31 = vshufps_avx(auVar44,auVar44,0xaa);
      stack_node[0xce].ptr = auVar31._0_8_;
      stack_node[0xcf].ptr = auVar31._8_8_;
      pNVar18 = stack_node + 0xee;
      do {
        auVar31 = auVar33._0_16_;
        stack_node[0xc4].ptr = auVar31._0_8_;
        stack_node[0xc5].ptr = auVar31._8_8_;
        auVar31 = vshufps_avx(auVar31,auVar31,0);
        stack_node[0xb0].ptr = auVar31._0_8_;
        stack_node[0xb1].ptr = auVar31._8_8_;
LAB_0037d186:
        do {
          if (pNVar18 == stack_node + 0xec) {
            if (stack_node[0xb3].ptr == 0) {
              return;
            }
            goto LAB_0037ce21;
          }
          uVar21 = (undefined4)pNVar18[-1].ptr;
          auVar43._4_4_ = uVar21;
          auVar43._0_4_ = uVar21;
          auVar43._8_4_ = uVar21;
          auVar43._12_4_ = uVar21;
          auVar33 = ZEXT1664(auVar43);
          pNVar18 = pNVar18 + -2;
          auVar43 = vcmpps_avx(auVar43,auVar80._0_16_,1);
        } while ((((auVar43 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                  (auVar43 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar43 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 -1 < auVar43[0xf]);
        sVar27 = pNVar18->ptr;
        while ((sVar27 & 8) == 0) {
          pfVar4 = (float *)(sVar27 + 0x20 + uVar25);
          auVar47._0_4_ = (float)stack_node[0xe6].ptr * *pfVar4;
          auVar47._4_4_ = stack_node[0xe6].ptr._4_4_ * pfVar4[1];
          auVar47._8_4_ = (float)stack_node[0xe7].ptr * pfVar4[2];
          auVar47._12_4_ = stack_node[0xe7].ptr._4_4_ * pfVar4[3];
          pfVar4 = (float *)(sVar27 + 0x20 + stack_node[0xb7].ptr);
          auVar55._0_4_ = (float)stack_node[0xe2].ptr * *pfVar4;
          auVar55._4_4_ = stack_node[0xe2].ptr._4_4_ * pfVar4[1];
          auVar55._8_4_ = (float)stack_node[0xe3].ptr * pfVar4[2];
          auVar55._12_4_ = stack_node[0xe3].ptr._4_4_ * pfVar4[3];
          auVar43 = vsubps_avx(auVar47,stack_node._1824_16_);
          auVar44 = vsubps_avx(auVar55,stack_node._1792_16_);
          pfVar4 = (float *)(sVar27 + 0x20 + uVar20);
          auVar63._0_4_ = (float)stack_node[0xde].ptr * *pfVar4;
          auVar63._4_4_ = stack_node[0xde].ptr._4_4_ * pfVar4[1];
          auVar63._8_4_ = (float)stack_node[0xdf].ptr * pfVar4[2];
          auVar63._12_4_ = stack_node[0xdf].ptr._4_4_ * pfVar4[3];
          auVar43 = vpmaxsd_avx(auVar43,auVar44);
          auVar44 = vsubps_avx(auVar63,stack_node._1760_16_);
          auVar44 = vpmaxsd_avx(auVar44,stack_node._1696_16_);
          auVar43 = vpmaxsd_avx(auVar43,auVar44);
          pfVar4 = (float *)(sVar27 + 0x20 + (uVar25 ^ 0x10));
          auVar56._0_4_ = (float)stack_node[0xda].ptr * *pfVar4;
          auVar56._4_4_ = stack_node[0xda].ptr._4_4_ * pfVar4[1];
          auVar56._8_4_ = (float)stack_node[0xdb].ptr * pfVar4[2];
          auVar56._12_4_ = stack_node[0xdb].ptr._4_4_ * pfVar4[3];
          pfVar4 = (float *)(sVar27 + 0x20 + stack_node[0xb6].ptr);
          auVar64._0_4_ = (float)stack_node[0xd6].ptr * *pfVar4;
          auVar64._4_4_ = stack_node[0xd6].ptr._4_4_ * pfVar4[1];
          auVar64._8_4_ = (float)stack_node[0xd7].ptr * pfVar4[2];
          auVar64._12_4_ = stack_node[0xd7].ptr._4_4_ * pfVar4[3];
          auVar44 = vsubps_avx(auVar56,stack_node._1728_16_);
          auVar47 = vsubps_avx(auVar64,stack_node._1680_16_);
          pfVar4 = (float *)(sVar27 + 0x20 + (uVar20 ^ 0x10));
          auVar72._0_4_ = (float)stack_node[0xd0].ptr * *pfVar4;
          auVar72._4_4_ = stack_node[0xd0].ptr._4_4_ * pfVar4[1];
          auVar72._8_4_ = (float)stack_node[0xd1].ptr * pfVar4[2];
          auVar72._12_4_ = stack_node[0xd1].ptr._4_4_ * pfVar4[3];
          auVar44 = vpminsd_avx(auVar44,auVar47);
          auVar47 = vsubps_avx(auVar72,stack_node._1648_16_);
          auVar47 = vpminsd_avx(auVar47,auVar31);
          auVar44 = vpminsd_avx(auVar44,auVar47);
          stack_node[0xea].ptr = auVar43._0_8_;
          stack_node[0xeb].ptr = auVar43._8_8_;
          auVar43 = vcmpps_avx(auVar43,auVar44,2);
          uVar13 = vmovmskps_avx(auVar43);
          if (uVar13 == 0) {
            bVar12 = false;
            sVar15 = sVar27;
          }
          else {
            uVar22 = (ulong)(uVar13 & 0xff);
            auVar33 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            uVar24 = 0;
            sVar14 = 8;
            do {
              lVar17 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                }
              }
              uVar21 = *(undefined4 *)(sVar27 + 0x20 + lVar17 * 4);
              auVar48._4_4_ = uVar21;
              auVar48._0_4_ = uVar21;
              auVar48._8_4_ = uVar21;
              auVar48._12_4_ = uVar21;
              auVar43 = vsubps_avx(auVar48,auVar92._0_16_);
              auVar49._0_4_ = auVar103._0_4_ * auVar43._0_4_;
              auVar49._4_4_ = auVar103._4_4_ * auVar43._4_4_;
              auVar49._8_4_ = auVar103._8_4_ * auVar43._8_4_;
              auVar49._12_4_ = auVar103._12_4_ * auVar43._12_4_;
              uVar21 = *(undefined4 *)(sVar27 + 0x40 + lVar17 * 4);
              auVar57._4_4_ = uVar21;
              auVar57._0_4_ = uVar21;
              auVar57._8_4_ = uVar21;
              auVar57._12_4_ = uVar21;
              auVar43 = vsubps_avx(auVar57,auVar95._0_16_);
              auVar58._0_4_ = auVar32._0_4_ * auVar43._0_4_;
              auVar58._4_4_ = auVar32._4_4_ * auVar43._4_4_;
              auVar58._8_4_ = auVar32._8_4_ * auVar43._8_4_;
              auVar58._12_4_ = auVar32._12_4_ * auVar43._12_4_;
              uVar21 = *(undefined4 *)(sVar27 + 0x60 + lVar17 * 4);
              auVar65._4_4_ = uVar21;
              auVar65._0_4_ = uVar21;
              auVar65._8_4_ = uVar21;
              auVar65._12_4_ = uVar21;
              auVar43 = vsubps_avx(auVar65,auVar99._0_16_);
              auVar66._0_4_ = auVar104._0_4_ * auVar43._0_4_;
              auVar66._4_4_ = auVar104._4_4_ * auVar43._4_4_;
              auVar66._8_4_ = auVar104._8_4_ * auVar43._8_4_;
              auVar66._12_4_ = auVar104._12_4_ * auVar43._12_4_;
              uVar21 = *(undefined4 *)(sVar27 + 0x30 + lVar17 * 4);
              auVar73._4_4_ = uVar21;
              auVar73._0_4_ = uVar21;
              auVar73._8_4_ = uVar21;
              auVar73._12_4_ = uVar21;
              auVar43 = vsubps_avx(auVar73,auVar92._0_16_);
              auVar74._0_4_ = auVar103._0_4_ * auVar43._0_4_;
              auVar74._4_4_ = auVar103._4_4_ * auVar43._4_4_;
              auVar74._8_4_ = auVar103._8_4_ * auVar43._8_4_;
              auVar74._12_4_ = auVar103._12_4_ * auVar43._12_4_;
              auVar53 = auVar80._0_16_;
              uVar21 = *(undefined4 *)(sVar27 + 0x50 + lVar17 * 4);
              auVar78._4_4_ = uVar21;
              auVar78._0_4_ = uVar21;
              auVar78._8_4_ = uVar21;
              auVar78._12_4_ = uVar21;
              auVar43 = vsubps_avx(auVar78,auVar95._0_16_);
              auVar79._0_4_ = auVar32._0_4_ * auVar43._0_4_;
              auVar79._4_4_ = auVar32._4_4_ * auVar43._4_4_;
              auVar79._8_4_ = auVar32._8_4_ * auVar43._8_4_;
              auVar79._12_4_ = auVar32._12_4_ * auVar43._12_4_;
              uVar21 = *(undefined4 *)(sVar27 + 0x70 + lVar17 * 4);
              auVar82._4_4_ = uVar21;
              auVar82._0_4_ = uVar21;
              auVar82._8_4_ = uVar21;
              auVar82._12_4_ = uVar21;
              auVar43 = vsubps_avx(auVar82,auVar99._0_16_);
              auVar83._0_4_ = auVar104._0_4_ * auVar43._0_4_;
              auVar83._4_4_ = auVar104._4_4_ * auVar43._4_4_;
              auVar83._8_4_ = auVar104._8_4_ * auVar43._8_4_;
              auVar83._12_4_ = auVar104._12_4_ * auVar43._12_4_;
              auVar43 = vpminsd_avx(auVar49,auVar74);
              auVar44 = vpminsd_avx(auVar58,auVar79);
              auVar43 = vpmaxsd_avx(auVar43,auVar44);
              auVar55 = vpminsd_avx(auVar66,auVar83);
              auVar44 = vpmaxsd_avx(auVar49,auVar74);
              auVar47 = vpmaxsd_avx(auVar58,auVar79);
              auVar80 = ZEXT1664(auVar53);
              auVar54 = vpminsd_avx(auVar44,auVar47);
              auVar44 = vpmaxsd_avx(auVar66,auVar83);
              auVar47 = vpmaxsd_avx(auVar55,stack_node._1856_16_);
              auVar43 = vpmaxsd_avx(auVar43,auVar47);
              auVar44 = vpminsd_avx(auVar44,auVar53);
              auVar44 = vpminsd_avx(auVar54,auVar44);
              auVar43 = vcmpps_avx(auVar43,auVar44,2);
              sVar15 = sVar14;
              if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar43[0xf] < '\0') {
                uVar21 = *(undefined4 *)((long)&stack_node[0xea].ptr + lVar17 * 4);
                auVar50._4_4_ = uVar21;
                auVar50._0_4_ = uVar21;
                auVar50._8_4_ = uVar21;
                auVar50._12_4_ = uVar21;
                sVar15 = *(size_t *)(sVar27 + lVar17 * 8);
                auVar44 = auVar33._0_16_;
                auVar43 = vcmpps_avx(auVar50,auVar44,1);
                if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar43 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar43 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar43[0xf]) {
                  pNVar18->ptr = sVar15;
                  sVar15 = sVar14;
                }
                else {
                  if (sVar14 == 8) {
                    auVar33 = ZEXT1664(auVar50);
                    goto LAB_0037d3a8;
                  }
                  pNVar18->ptr = sVar14;
                  auVar33 = ZEXT1664(auVar50);
                  auVar50 = auVar44;
                }
                uVar24 = uVar24 + 1;
                *(int *)&pNVar18[1].ptr = auVar50._0_4_;
                pNVar18 = pNVar18 + 2;
              }
LAB_0037d3a8:
              uVar22 = uVar22 & uVar22 - 1;
              sVar14 = sVar15;
            } while (uVar22 != 0);
            if (sVar15 == 8) {
              bVar12 = false;
            }
            else {
              bVar12 = true;
              if (1 < uVar24) {
                pNVar1 = pNVar18 + -4;
                pNVar2 = pNVar18 + -2;
                if ((uint)pNVar18[-3].ptr < (uint)pNVar18[-1].ptr) {
                  sVar27 = pNVar1->ptr;
                  sVar14 = pNVar18[-3].ptr;
                  stack_node._1392_16_ = *(undefined1 (*) [16])pNVar1;
                  *(int *)&pNVar18[-3].ptr = (int)pNVar18[-1].ptr;
                  pNVar1->ptr = pNVar2->ptr;
                  pNVar2->ptr = sVar27;
                  stack_node[0xaf].ptr._0_4_ = (undefined4)sVar14;
                  *(undefined4 *)&pNVar18[-1].ptr = (undefined4)stack_node[0xaf].ptr;
                }
                stack_node[0xab].ptr = 8;
                if (uVar24 != 2) {
                  pNVar3 = pNVar18 + -6;
                  if ((uint)pNVar18[-5].ptr < (uint)pNVar18[-1].ptr) {
                    sVar27 = pNVar3->ptr;
                    sVar14 = pNVar18[-5].ptr;
                    stack_node._1392_16_ = *(undefined1 (*) [16])pNVar3;
                    *(int *)&pNVar18[-5].ptr = (int)pNVar18[-1].ptr;
                    pNVar3->ptr = pNVar2->ptr;
                    pNVar2->ptr = sVar27;
                    stack_node[0xaf].ptr._0_4_ = (undefined4)sVar14;
                    *(undefined4 *)&pNVar18[-1].ptr = (undefined4)stack_node[0xaf].ptr;
                  }
                  stack_node[0xab].ptr = 8;
                  if ((uint)pNVar18[-5].ptr < (uint)pNVar18[-3].ptr) {
                    sVar27 = pNVar3->ptr;
                    sVar14 = pNVar18[-5].ptr;
                    stack_node._1392_16_ = *(undefined1 (*) [16])pNVar3;
                    *(int *)&pNVar18[-5].ptr = (int)pNVar18[-3].ptr;
                    pNVar3->ptr = pNVar1->ptr;
                    pNVar1->ptr = sVar27;
                    stack_node[0xaf].ptr._0_4_ = (undefined4)sVar14;
                    *(undefined4 *)&pNVar18[-3].ptr = (undefined4)stack_node[0xaf].ptr;
                  }
                }
              }
            }
          }
          sVar27 = sVar15;
          if (!bVar12) goto LAB_0037d186;
        }
        auVar43 = auVar80._0_16_;
        auVar31 = vcmpps_avx(auVar43,auVar33._0_16_,6);
        stack_node[0xae].ptr = auVar31._0_8_;
        stack_node[0xaf].ptr = auVar31._8_8_;
        if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar31 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar31 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar31[0xf]
           ) goto LAB_0037d5c5;
        stack_node[0xcc].ptr = auVar43._0_8_;
        stack_node[0xcd].ptr = auVar43._8_8_;
        NVar16.ptr = (ulong)((uint)sVar27 & 0xf) - 8;
        if (NVar16.ptr != 0) {
          pPVar26 = (Primitive *)(sVar27 & 0xfffffffffffffff0);
          do {
            stack_node[0xb0].ptr = NVar16.ptr;
            stack_node[0xab].ptr = 0x37d4eb;
            InstanceIntersectorK<4>::intersect
                      ((vbool<4> *)(stack_node + 0xae),
                       (Precalculations *)((long)&stack_node[0xad].ptr + 7),ray,context,pPVar26);
            pPVar26 = pPVar26 + 1;
            NVar16.ptr = stack_node[0xb0].ptr - 1;
            context = (RayQueryContext *)stack_node[0xb5];
            ray = (RayHitK<4> *)stack_node[0xb4];
          } while (NVar16.ptr != 0);
        }
        auVar80 = ZEXT1664(stack_node._1632_16_);
        auVar31 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),stack_node._1632_16_,1);
        auVar31 = stack_node._1392_16_ & auVar31;
        if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar31 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar31 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar31[0xf]
           ) {
          auVar92 = ZEXT1664(stack_node._1552_16_);
          auVar95 = ZEXT1664(stack_node._1536_16_);
          auVar99 = ZEXT1664(stack_node._1520_16_);
          auVar103 = ZEXT1664(stack_node._1504_16_);
          auVar32 = ZEXT1664(stack_node._1488_16_);
          auVar104 = ZEXT1664(stack_node._1472_16_);
          stack_node[0xab].ptr = 8;
LAB_0037d5c5:
          auVar33 = ZEXT1664(stack_node._1568_16_);
        }
        else {
          auVar31 = vblendvps_avx(stack_node._1632_16_,*(undefined1 (*) [16])(ray + 0x80),
                                  stack_node._1392_16_);
          auVar80 = ZEXT1664(auVar31);
          auVar43 = vshufps_avx(auVar31,auVar31,0xb1);
          auVar31 = vmaxps_avx(auVar43,auVar31);
          auVar43 = vshufpd_avx(auVar31,auVar31,1);
          auVar31 = vmaxss_avx(auVar43,auVar31);
          auVar33 = ZEXT1664(auVar31);
          auVar92 = ZEXT1664(stack_node._1552_16_);
          auVar95 = ZEXT1664(stack_node._1536_16_);
          auVar99 = ZEXT1664(stack_node._1520_16_);
          auVar103 = ZEXT1664(stack_node._1504_16_);
          auVar32 = ZEXT1664(stack_node._1488_16_);
          auVar104 = ZEXT1664(stack_node._1472_16_);
          stack_node[0xab].ptr = 8;
        }
      } while( true );
    }
    auVar31 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar43 = vpcmpeqd_avx((undefined1  [16])valid_i->field_0,auVar31);
    iVar19 = vmovmskps_avx(auVar43);
    uVar20 = CONCAT44((int)((ulong)This >> 0x20),iVar19);
    if (iVar19 != 0) {
      auVar44 = *(undefined1 (*) [16])(ray + 0x40);
      auVar34._8_4_ = 0x7fffffff;
      auVar34._0_8_ = 0x7fffffff7fffffff;
      auVar34._12_4_ = 0x7fffffff;
      auVar47 = vandps_avx(auVar44,auVar34);
      auVar67._8_4_ = 0x219392ef;
      auVar67._0_8_ = 0x219392ef219392ef;
      auVar67._12_4_ = 0x219392ef;
      auVar47 = vcmpps_avx(auVar47,auVar67,1);
      auVar55 = vblendvps_avx(auVar44,auVar67,auVar47);
      auVar47 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar34);
      auVar47 = vcmpps_avx(auVar47,auVar67,1);
      auVar54 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar67,auVar47);
      auVar47 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar34);
      auVar47 = vcmpps_avx(auVar47,auVar67,1);
      auVar47 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar67,auVar47);
      auVar53 = vrcpps_avx(auVar55);
      local_1728 = auVar53._0_4_;
      auVar51._0_4_ = auVar55._0_4_ * local_1728;
      fStack_1724 = auVar53._4_4_;
      auVar51._4_4_ = auVar55._4_4_ * fStack_1724;
      fStack_1720 = auVar53._8_4_;
      auVar51._8_4_ = auVar55._8_4_ * fStack_1720;
      fStack_171c = auVar53._12_4_;
      auVar51._12_4_ = auVar55._12_4_ * fStack_171c;
      auVar86._8_4_ = 0x3f800000;
      auVar86._0_8_ = &DAT_3f8000003f800000;
      auVar86._12_4_ = 0x3f800000;
      auVar53 = vsubps_avx(auVar86,auVar51);
      auVar55 = vrcpps_avx(auVar54);
      local_1738 = auVar55._0_4_;
      auVar68._0_4_ = auVar54._0_4_ * local_1738;
      fStack_1734 = auVar55._4_4_;
      auVar68._4_4_ = auVar54._4_4_ * fStack_1734;
      fStack_1730 = auVar55._8_4_;
      auVar68._8_4_ = auVar54._8_4_ * fStack_1730;
      fStack_172c = auVar55._12_4_;
      auVar68._12_4_ = auVar54._12_4_ * fStack_172c;
      auVar54 = vsubps_avx(auVar86,auVar68);
      auVar55 = vrcpps_avx(auVar47);
      local_1748 = auVar55._0_4_;
      auVar84._0_4_ = auVar47._0_4_ * local_1748;
      fStack_1744 = auVar55._4_4_;
      auVar84._4_4_ = auVar47._4_4_ * fStack_1744;
      fStack_1740 = auVar55._8_4_;
      auVar84._8_4_ = auVar47._8_4_ * fStack_1740;
      fStack_173c = auVar55._12_4_;
      auVar84._12_4_ = auVar47._12_4_ * fStack_173c;
      auVar55 = vsubps_avx(auVar86,auVar84);
      auVar62 = ZEXT816(0);
      auVar44 = vcmpps_avx(auVar44,auVar62,1);
      auVar90._8_4_ = 1;
      auVar90._0_8_ = 0x100000001;
      auVar90._12_4_ = 1;
      auVar44 = vandps_avx(auVar90,auVar44);
      auVar47 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar62,1);
      auVar91._8_4_ = 2;
      auVar91._0_8_ = 0x200000002;
      auVar91._12_4_ = 2;
      auVar47 = vandps_avx(auVar47,auVar91);
      auVar92 = ZEXT1664(*(undefined1 (*) [16])ray);
      auVar47 = vorps_avx(auVar47,auVar44);
      auVar44 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar62,1);
      auVar87._8_4_ = 4;
      auVar87._0_8_ = 0x400000004;
      auVar87._12_4_ = 4;
      auVar44 = vandps_avx(auVar87,auVar44);
      auVar95 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x10));
      auVar99 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x20));
      auVar31 = vpor_avx(auVar43 ^ auVar31,auVar44);
      local_1768 = vpor_avx(auVar47,auVar31);
      do {
        lVar17 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
          }
        }
        uVar21 = *(undefined4 *)(local_1768 + lVar17 * 4);
        auVar89._4_4_ = uVar21;
        auVar89._0_4_ = uVar21;
        auVar89._8_4_ = uVar21;
        auVar89._12_4_ = uVar21;
        auVar31 = vpcmpeqd_avx(auVar89,local_1768);
        uVar21 = vmovmskps_avx(auVar31);
        uVar20 = uVar20 & ~CONCAT44((int)((ulong)lVar17 >> 0x20),uVar21);
      } while (uVar20 != 0);
      auVar31 = vpcmpeqd_avx(local_1768,local_1768);
      auVar44 = vpcmpeqd_avx(auVar31,(undefined1  [16])valid_i->field_0);
      local_1728 = local_1728 + auVar53._0_4_ * local_1728;
      fStack_1724 = fStack_1724 + auVar53._4_4_ * fStack_1724;
      fStack_1720 = fStack_1720 + auVar53._8_4_ * fStack_1720;
      fStack_171c = fStack_171c + auVar53._12_4_ * fStack_171c;
      local_1738 = local_1738 + local_1738 * auVar54._0_4_;
      fStack_1734 = fStack_1734 + fStack_1734 * auVar54._4_4_;
      fStack_1730 = fStack_1730 + fStack_1730 * auVar54._8_4_;
      fStack_172c = fStack_172c + fStack_172c * auVar54._12_4_;
      local_1748 = auVar55._0_4_ * local_1748 + local_1748;
      fStack_1744 = auVar55._4_4_ * fStack_1744 + fStack_1744;
      fStack_1740 = auVar55._8_4_ * fStack_1740 + fStack_1740;
      fStack_173c = auVar55._12_4_ * fStack_173c + fStack_173c;
      auVar31 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x20);
      auVar43 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x20);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar103 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      local_16e8.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar31,auVar44);
      auVar45._8_4_ = 0xff800000;
      auVar45._0_8_ = 0xff800000ff800000;
      auVar45._12_4_ = 0xff800000;
      bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                     vblendvps_avx(auVar45,auVar43,auVar44);
      pNVar18 = stack_node + 2;
      paVar28 = &stack_near[2].field_0;
      local_1768 = vorps_avx(auVar44,local_1768);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      stack_near[1].field_0 = local_16e8;
      local_1750 = context;
      do {
        paVar28 = paVar28 + -1;
        pNVar1 = pNVar18 + -1;
        pNVar18 = pNVar18 + -1;
        bVar12 = true;
        if (pNVar1->ptr != 0xfffffffffffffff8) {
          auVar32 = ZEXT1664((undefined1  [16])*paVar28);
          auVar31 = vcmpps_avx((undefined1  [16])*paVar28,(undefined1  [16])bi_8.field_0,1);
          sVar27 = pNVar1->ptr;
          if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar31[0xf] < '\0') {
            do {
              local_16f8 = auVar92._0_16_;
              local_1708 = auVar95._0_16_;
              local_1718 = auVar99._0_16_;
              if ((sVar27 & 8) != 0) {
                if (sVar27 == 0xfffffffffffffff8) goto LAB_0033457b;
                valid_leaf.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vcmpps_avx((undefined1  [16])bi_8.field_0,auVar32._0_16_,6);
                if (((((undefined1  [16])valid_leaf.field_0 >> 0x1f & (undefined1  [16])0x1) !=
                      (undefined1  [16])0x0 ||
                     ((undefined1  [16])valid_leaf.field_0 >> 0x3f & (undefined1  [16])0x1) !=
                     (undefined1  [16])0x0) ||
                    ((undefined1  [16])valid_leaf.field_0 >> 0x5f & (undefined1  [16])0x1) !=
                    (undefined1  [16])0x0) || valid_leaf.field_0._15_1_ < '\0') {
                  lVar17 = (ulong)((uint)sVar27 & 0xf) - 8;
                  if (lVar17 != 0) {
                    pPVar26 = (Primitive *)(sVar27 & 0xfffffffffffffff0);
                    do {
                      InstanceIntersectorK<4>::intersect(&valid_leaf,&pre,ray,local_1750,pPVar26);
                      pPVar26 = pPVar26 + 1;
                      lVar17 = lVar17 + -1;
                    } while (lVar17 != 0);
                  }
                  bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                 vblendvps_avx((undefined1  [16])bi_8.field_0,
                                               *(undefined1 (*) [16])(ray + 0x80),
                                               (undefined1  [16])valid_leaf.field_0);
                  auVar92 = ZEXT1664(local_16f8);
                  auVar95 = ZEXT1664(local_1708);
                  auVar99 = ZEXT1664(local_1718);
                  auVar103 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                }
                break;
              }
              uVar25 = 0;
              auVar32 = ZEXT1664(auVar103._0_16_);
              uVar20 = 0;
              sVar15 = 8;
              do {
                sVar14 = *(size_t *)((sVar27 & 0xfffffffffffffff0) + uVar20 * 8);
                if (sVar14 != 8) {
                  uVar21 = *(undefined4 *)(sVar27 + 0x20 + uVar20 * 4);
                  auVar35._4_4_ = uVar21;
                  auVar35._0_4_ = uVar21;
                  auVar35._8_4_ = uVar21;
                  auVar35._12_4_ = uVar21;
                  auVar31 = vsubps_avx(auVar35,local_16f8);
                  auVar46._0_4_ = local_1728 * auVar31._0_4_;
                  auVar46._4_4_ = fStack_1724 * auVar31._4_4_;
                  auVar46._8_4_ = fStack_1720 * auVar31._8_4_;
                  auVar46._12_4_ = fStack_171c * auVar31._12_4_;
                  uVar21 = *(undefined4 *)(sVar27 + 0x40 + uVar20 * 4);
                  auVar36._4_4_ = uVar21;
                  auVar36._0_4_ = uVar21;
                  auVar36._8_4_ = uVar21;
                  auVar36._12_4_ = uVar21;
                  auVar31 = vsubps_avx(auVar36,local_1708);
                  auVar52._0_4_ = local_1738 * auVar31._0_4_;
                  auVar52._4_4_ = fStack_1734 * auVar31._4_4_;
                  auVar52._8_4_ = fStack_1730 * auVar31._8_4_;
                  auVar52._12_4_ = fStack_172c * auVar31._12_4_;
                  uVar21 = *(undefined4 *)(sVar27 + 0x60 + uVar20 * 4);
                  auVar37._4_4_ = uVar21;
                  auVar37._0_4_ = uVar21;
                  auVar37._8_4_ = uVar21;
                  auVar37._12_4_ = uVar21;
                  auVar31 = vsubps_avx(auVar37,local_1718);
                  auVar59._0_4_ = local_1748 * auVar31._0_4_;
                  auVar59._4_4_ = fStack_1744 * auVar31._4_4_;
                  auVar59._8_4_ = fStack_1740 * auVar31._8_4_;
                  auVar59._12_4_ = fStack_173c * auVar31._12_4_;
                  uVar21 = *(undefined4 *)(sVar27 + 0x30 + uVar20 * 4);
                  auVar38._4_4_ = uVar21;
                  auVar38._0_4_ = uVar21;
                  auVar38._8_4_ = uVar21;
                  auVar38._12_4_ = uVar21;
                  auVar31 = vsubps_avx(auVar38,local_16f8);
                  auVar69._0_4_ = local_1728 * auVar31._0_4_;
                  auVar69._4_4_ = fStack_1724 * auVar31._4_4_;
                  auVar69._8_4_ = fStack_1720 * auVar31._8_4_;
                  auVar69._12_4_ = fStack_171c * auVar31._12_4_;
                  uVar21 = *(undefined4 *)(sVar27 + 0x50 + uVar20 * 4);
                  auVar39._4_4_ = uVar21;
                  auVar39._0_4_ = uVar21;
                  auVar39._8_4_ = uVar21;
                  auVar39._12_4_ = uVar21;
                  auVar31 = vsubps_avx(auVar39,local_1708);
                  auVar75._0_4_ = local_1738 * auVar31._0_4_;
                  auVar75._4_4_ = fStack_1734 * auVar31._4_4_;
                  auVar75._8_4_ = fStack_1730 * auVar31._8_4_;
                  auVar75._12_4_ = fStack_172c * auVar31._12_4_;
                  uVar21 = *(undefined4 *)(sVar27 + 0x70 + uVar20 * 4);
                  auVar40._4_4_ = uVar21;
                  auVar40._0_4_ = uVar21;
                  auVar40._8_4_ = uVar21;
                  auVar40._12_4_ = uVar21;
                  auVar31 = vsubps_avx(auVar40,local_1718);
                  auVar81._0_4_ = local_1748 * auVar31._0_4_;
                  auVar81._4_4_ = fStack_1744 * auVar31._4_4_;
                  auVar81._8_4_ = fStack_1740 * auVar31._8_4_;
                  auVar81._12_4_ = fStack_173c * auVar31._12_4_;
                  auVar31 = vpminsd_avx(auVar46,auVar69);
                  auVar43 = vpminsd_avx(auVar52,auVar75);
                  auVar31 = vpmaxsd_avx(auVar31,auVar43);
                  auVar43 = vpminsd_avx(auVar59,auVar81);
                  auVar43 = vpmaxsd_avx(auVar31,auVar43);
                  auVar31 = vpmaxsd_avx(auVar46,auVar69);
                  auVar44 = vpmaxsd_avx(auVar52,auVar75);
                  auVar47 = vpminsd_avx(auVar31,auVar44);
                  auVar31 = vpmaxsd_avx(auVar59,auVar81);
                  auVar44 = vpmaxsd_avx(auVar43,(undefined1  [16])local_16e8);
                  auVar31 = vpminsd_avx(auVar31,(undefined1  [16])bi_8.field_0);
                  auVar31 = vpminsd_avx(auVar47,auVar31);
                  auVar31 = vcmpps_avx(auVar44,auVar31,2);
                  if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar31[0xf] < '\0') {
                    aVar5 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                            vblendvps_avx(auVar103._0_16_,auVar43,auVar31);
                    aVar30 = auVar32._0_16_;
                    auVar31 = vcmpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar30,1);
                    sVar23 = sVar14;
                    aVar10 = aVar30;
                    aVar11 = aVar5;
                    if (((((auVar31 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                          (auVar31 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar31 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         -1 < auVar31[0xf]) ||
                       (bVar29 = sVar15 != 8, sVar23 = sVar15, sVar15 = sVar14, aVar10 = aVar5,
                       aVar11 = aVar30, bVar29)) {
                      uVar25 = uVar25 + 1;
                      pNVar18->ptr = sVar23;
                      pNVar18 = pNVar18 + 1;
                      *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar28->v = aVar11;
                      paVar28 = paVar28 + 1;
                      auVar32 = ZEXT1664((undefined1  [16])aVar10);
                    }
                    else {
                      auVar32 = ZEXT1664((undefined1  [16])aVar5);
                    }
                  }
                }
              } while ((sVar14 != 8) && (bVar29 = uVar20 < 3, uVar20 = uVar20 + 1, bVar29));
              if (1 < uVar25 && sVar15 != 8) {
                aVar5 = paVar28[-2];
                auVar31 = vcmpps_avx((undefined1  [16])aVar5,(undefined1  [16])paVar28[-1],1);
                if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar31[0xf] < '\0') {
                  paVar28[-2] = paVar28[-1];
                  paVar28[-1] = aVar5;
                  auVar31 = vpermilps_avx(*(undefined1 (*) [16])(pNVar18 + -2),0x4e);
                  *(undefined1 (*) [16])(pNVar18 + -2) = auVar31;
                }
                if (uVar25 != 2) {
                  aVar5 = paVar28[-3];
                  auVar31 = vcmpps_avx((undefined1  [16])aVar5,(undefined1  [16])paVar28[-1],1);
                  if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar31[0xf] < '\0') {
                    paVar28[-3] = paVar28[-1];
                    paVar28[-1] = aVar5;
                    sVar27 = pNVar18[-3].ptr;
                    pNVar18[-3].ptr = pNVar18[-1].ptr;
                    pNVar18[-1].ptr = sVar27;
                  }
                  aVar5 = paVar28[-3];
                  auVar31 = vcmpps_avx((undefined1  [16])aVar5,(undefined1  [16])paVar28[-2],1);
                  if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar31[0xf] < '\0') {
                    paVar28[-3] = paVar28[-2];
                    paVar28[-2] = aVar5;
                    auVar31 = vpermilps_avx(*(undefined1 (*) [16])(pNVar18 + -3),0x4e);
                    *(undefined1 (*) [16])(pNVar18 + -3) = auVar31;
                  }
                }
              }
              sVar27 = sVar15;
            } while (sVar15 != 8);
          }
          bVar12 = false;
        }
LAB_0033457b:
      } while (!bVar12);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }